

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackNN.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  uint vec_len;
  uint vec_len_00;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  long *plVar5;
  NaDataFile *df;
  NaDataFile *df_00;
  double *pdVar6;
  void *pvVar7;
  NaReal *vec;
  NaReal *vec_00;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined8 uVar12;
  uint local_d6c;
  NaNNUnit nnu;
  NaStdBackProp bpe;
  
  if (argc == 6) {
    NaOpenLogFile("BackNN.log");
    signal(2,handle_sigint);
    NaNNUnit::NaNNUnit(&nnu);
    NaNNUnit::Load((char *)&nnu);
    vec_len = NaUnit::InputDim();
    vec_len_00 = NaUnit::OutputDim();
    plVar4 = (long *)OpenInputDataFile(argv[2]);
    plVar5 = (long *)OpenInputDataFile(argv[3]);
    df = (NaDataFile *)OpenOutputDataFile(argv[4],bdtAuto,vec_len_00);
    df_00 = (NaDataFile *)OpenOutputDataFile(argv[5],bdtAuto,vec_len);
    NaStdBackProp::NaStdBackProp(&bpe,&nnu);
    uVar9 = (ulong)vec_len;
    pdVar6 = (double *)operator_new__(uVar9 * 8);
    uVar10 = (ulong)vec_len_00 * 8;
    pvVar7 = operator_new__(uVar10);
    vec = (NaReal *)operator_new__(uVar10);
    vec_00 = (NaReal *)operator_new__(uVar9 * 8);
    cVar1 = (**(code **)(*plVar4 + 0x28))(plVar4);
    if (cVar1 != '\0') {
      cVar1 = (**(code **)(*plVar5 + 0x28))(plVar5);
      if (cVar1 != '\0') {
        local_d6c = 0;
        do {
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            dVar11 = (double)(**(code **)(*plVar4 + 0x18))(plVar4,uVar10 & 0xffffffff);
            pdVar6[uVar10] = dVar11;
          }
          for (uVar10 = 0; vec_len_00 != uVar10; uVar10 = uVar10 + 1) {
            uVar12 = (**(code **)(*plVar5 + 0x18))(plVar5,uVar10 & 0xffffffff);
            *(undefined8 *)((long)pvVar7 + uVar10 * 8) = uVar12;
          }
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            vec_00[uVar10] = 0.0;
          }
          NaNNUnit::Function((double *)&nnu,pdVar6);
          uVar2 = NaNNUnit::OutputLayer();
          local_d6c = local_d6c + 1;
          for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
            uVar3 = NaNNUnit::OutputLayer();
            if (uVar2 == uVar3) {
              NaStdBackProp::DeltaRule((double *)&bpe,SUB81(pvVar7,0));
            }
            else {
              NaStdBackProp::DeltaRule((uint)&bpe,uVar2);
            }
          }
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            dVar11 = (double)NaStdBackProp::PartOfDeltaRule((uint)&bpe,0);
            vec_00[uVar10] = vec_00[uVar10] - dVar11;
          }
          write_output(df,vec_len_00,vec);
          write_output(df_00,vec_len,vec_00);
          printf("%d records done\r",(ulong)local_d6c);
          if (bTerminate != false) break;
          cVar1 = (**(code **)(*plVar4 + 0x20))(plVar4);
          if (cVar1 == '\0') break;
          cVar1 = (**(code **)(*plVar5 + 0x20))(plVar5);
        } while (cVar1 != '\0');
      }
    }
    putchar(10);
    if (df_00 != (NaDataFile *)0x0) {
      (**(code **)(*(long *)df_00 + 8))();
    }
    if (df != (NaDataFile *)0x0) {
      (**(code **)(*(long *)df + 8))();
    }
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 8))(plVar5);
    }
    (**(code **)(*plVar4 + 8))(plVar4);
    NaStdBackProp::~NaStdBackProp(&bpe);
    NaNNUnit::~NaNNUnit(&nnu);
    iVar8 = 0;
  }
  else {
    printf("Usage: %s NN-file DataIn DesiredOut DataOut ErrOnIn\n where NN-file    - evaluated neural network (not changed)\n       DataIn     - network input (=input dimension)\n       DesiredOut - target output (=output dimension)\n       DataOut    - output produced by the network\n       ErrOnIn    - error on input produced by the network\n"
           ,*argv);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 6)
    {
      printf("Usage: %s NN-file DataIn DesiredOut DataOut ErrOnIn\n"\
	     " where NN-file    - evaluated neural network (not changed)\n"\
	     "       DataIn     - network input (=input dimension)\n"\
	     "       DesiredOut - target output (=output dimension)\n"\
	     "       DataOut    - output produced by the network\n"\
	     "       ErrOnIn    - error on input produced by the network\n",
	     argv[0]);
      return 1;
    }

  NaOpenLogFile("BackNN.log");

  /* Let's handle SIGINT(2) */
  signal(SIGINT, handle_sigint);

  try{
    NaNNUnit            nnu;
    nnu.Load(argv[1]);

    unsigned	nInpDim = nnu.InputDim();
    unsigned	nOutDim = nnu.OutputDim();

    NaDataFile	*dfDataIn = OpenInputDataFile(argv[2]);
    NaDataFile	*dfTargetOut = OpenInputDataFile(argv[3]);
    NaDataFile	*dfDataOut = OpenOutputDataFile(argv[4], bdtAuto, nOutDim);
    NaDataFile	*dfErrOnIn = OpenOutputDataFile(argv[5], bdtAuto, nInpDim);

    NaStdBackProp	bpe(nnu);

    /* Prepare buffers for input, target and output data */
    NaReal	*pIn = new NaReal[nInpDim];
    NaReal	*pTar = new NaReal[nOutDim];
    NaReal	*pOut = new NaReal[nOutDim];
    NaReal	*pErr = new NaReal[nInpDim];

    /* Let's start the forward-backward propagation */
    int	iEpoch = 0, iLayer, j;

    if(dfDataIn->GoStartRecord() && dfTargetOut->GoStartRecord()) {
	int	nRecords = 0;

	do{
	    /* Read the learning pair */
	    for(j = 0; j < nInpDim; ++j)
		pIn[j] = dfDataIn->GetValue(j);
	    for(j = 0; j < nOutDim; ++j)
		pTar[j] = dfTargetOut->GetValue(j);

	    for(j = 0; j < nInpDim; ++j)
		pErr[j] = 0.0;

	    ++nRecords;

	    /* Pass through the net in forward direction */
	    nnu.Function(pIn, pOut);

	    /* Pass through the net in backward direction */
	    for(iLayer = nnu.OutputLayer(); iLayer >= 0; --iLayer)
		{
		    if(nnu.OutputLayer() == iLayer)
			/* Output layer */
			bpe.DeltaRule(pTar);
		    else
			/* Hidden layer */
			bpe.DeltaRule(iLayer, iLayer + 1);
		}

	    /* Compute error on input */
	    for(j = 0; j < nInpDim; ++j){
		// Or may be += ???  I didn't recognize the difference...
		pErr[j] -= bpe.PartOfDeltaRule(0, j);
	    }

	    write_output(dfDataOut, nOutDim, pOut);
	    write_output(dfErrOnIn, nInpDim, pErr);

	    /* Display epoch number, learning and testing errors */
	    printf("%d records done\r", nRecords);

	}while(!bTerminate
	       && dfDataIn->GoNextRecord()
	       && dfTargetOut->GoNextRecord());
    }

    putchar('\n');

    delete dfErrOnIn;
    delete dfDataOut;
    delete dfTargetOut;
    delete dfDataIn;
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
  }
}